

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::LiteralNumber::LiteralNumber
          (LiteralNumber *this,LocationRange *lr,Fodder *open_fodder,string *str)

{
  char *__nptr;
  string *in_RCX;
  Fodder *in_RDX;
  undefined8 in_RSI;
  LocationRange *in_RDI;
  double dVar1;
  AST *unaff_retaddr;
  
  AST::AST(unaff_retaddr,in_RDI,(ASTType)((ulong)in_RSI >> 0x20),in_RDX);
  *(undefined ***)&in_RDI->file = &PTR__LiteralNumber_003d3860;
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = strtod(__nptr,(char **)0x0);
  *(double *)&in_RDI[2].file = dVar1;
  std::__cxx11::string::string((string *)&in_RDI[2].file._M_string_length,in_RCX);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }